

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_its_file.c
# Opt level: O0

psa_status_t
psa_its_set(psa_storage_uid_t uid,uint32_t data_length,void *p_data,
           psa_storage_create_flags_t create_flags)

{
  int iVar1;
  size_t sVar2;
  int ret;
  size_t n;
  psa_its_file_header_t header;
  FILE *stream;
  char filename [25];
  psa_status_t status;
  psa_storage_create_flags_t create_flags_local;
  void *p_data_local;
  uint32_t data_length_local;
  psa_storage_uid_t uid_local;
  
  stack0xffffffffffffffd8 = -0x92;
  header.size[0] = '\0';
  header.size[1] = '\0';
  header.size[2] = '\0';
  header.size[3] = '\0';
  header.flags[0] = '\0';
  header.flags[1] = '\0';
  header.flags[2] = '\0';
  header.flags[3] = '\0';
  n._0_1_ = 'P';
  n._1_1_ = 'S';
  n._2_1_ = 'A';
  n._3_1_ = '\0';
  n._4_1_ = 'I';
  n._5_1_ = 'T';
  n._6_1_ = 'S';
  n._7_1_ = '\0';
  header.magic[0] = (uint8_t)data_length;
  header.magic[1] = (uint8_t)(data_length >> 8);
  header.magic[2] = (uint8_t)(data_length >> 0x10);
  header.magic[3] = (uint8_t)(data_length >> 0x18);
  header.magic[4] = (uint8_t)create_flags;
  header.magic[5] = (uint8_t)(create_flags >> 8);
  header.magic[6] = (uint8_t)(create_flags >> 0x10);
  header.magic[7] = (uint8_t)(create_flags >> 0x18);
  psa_its_fill_filename(uid,(char *)&stream);
  header._8_8_ = fopen("tempfile.psa_its","wb");
  if ((FILE *)header._8_8_ != (FILE *)0x0) {
    stack0xffffffffffffffd8 = -0x8e;
    sVar2 = fwrite(&n,1,0x10,(FILE *)header._8_8_);
    if ((sVar2 == 0x10) &&
       ((data_length == 0 ||
        (sVar2 = fwrite(p_data,1,(ulong)data_length,(FILE *)header._8_8_), sVar2 == data_length))))
    {
      stack0xffffffffffffffd8 = 0;
    }
  }
  if (((header._8_8_ != 0) && (iVar1 = fclose((FILE *)header._8_8_), stack0xffffffffffffffd8 == 0))
     && (iVar1 != 0)) {
    stack0xffffffffffffffd8 = -0x8e;
  }
  if ((stack0xffffffffffffffd8 == 0) &&
     (iVar1 = rename("tempfile.psa_its",(char *)&stream), iVar1 != 0)) {
    stack0xffffffffffffffd8 = -0x92;
  }
  remove("tempfile.psa_its");
  return stack0xffffffffffffffd8;
}

Assistant:

psa_status_t psa_its_set( psa_storage_uid_t uid,
                          uint32_t data_length,
                          const void *p_data,
                          psa_storage_create_flags_t create_flags )
{
    psa_status_t status = PSA_ERROR_STORAGE_FAILURE;
    char filename[PSA_ITS_STORAGE_FILENAME_LENGTH];
    FILE *stream = NULL;
    psa_its_file_header_t header;
    size_t n;

    memcpy( header.magic, PSA_ITS_MAGIC_STRING, PSA_ITS_MAGIC_LENGTH );
    header.size[0] = data_length & 0xff;
    header.size[1] = ( data_length >> 8 ) & 0xff;
    header.size[2] = ( data_length >> 16 ) & 0xff;
    header.size[3] = ( data_length >> 24 ) & 0xff;
    header.flags[0] = create_flags & 0xff;
    header.flags[1] = ( create_flags >> 8 ) & 0xff;
    header.flags[2] = ( create_flags >> 16 ) & 0xff;
    header.flags[3] = ( create_flags >> 24 ) & 0xff;

    psa_its_fill_filename( uid, filename );
    stream = fopen( PSA_ITS_STORAGE_TEMP, "wb" );
    if( stream == NULL )
        goto exit;

    status = PSA_ERROR_INSUFFICIENT_STORAGE;
    n = fwrite( &header, 1, sizeof( header ), stream );
    if( n != sizeof( header ) )
        goto exit;
    if( data_length != 0 )
    {
        n = fwrite( p_data, 1, data_length, stream );
        if( n != data_length )
            goto exit;
    }
    status = PSA_SUCCESS;

exit:
    if( stream != NULL )
    {
        int ret = fclose( stream );
        if( status == PSA_SUCCESS && ret != 0 )
            status = PSA_ERROR_INSUFFICIENT_STORAGE;
    }
    if( status == PSA_SUCCESS )
    {
        if( rename_replace_existing( PSA_ITS_STORAGE_TEMP, filename ) != 0 )
            status = PSA_ERROR_STORAGE_FAILURE;
    }
    remove( PSA_ITS_STORAGE_TEMP );
    return( status );
}